

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O2

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
::ThreadData::thread_procedure
          (ThreadData *this,size_t i_target_put_count,size_t i_target_consume_count,
          uint64_t i_affinity_mask)

{
  EasyRandom *i_random;
  int32_t iVar1;
  unsigned_long uVar2;
  char cVar3;
  size_t cycles;
  byte bVar4;
  ThreadAllocRandomFailures scoped_alloc_failures;
  
  set_thread_affinity(i_affinity_mask);
  i_random = (EasyRandom *)(this + 0x50);
  ThreadAllocRandomFailures::ThreadAllocRandomFailures(&scoped_alloc_failures,i_random,0.03);
  LOCK();
  *(undefined1 *)(*(long *)(this + 0x48) + 0x10) = 1;
  UNLOCK();
  cVar3 = '\0';
  bVar4 = 0;
  do {
    if (*(ulong *)(this + 0x13e0) < i_target_put_count) {
      uVar2 = EasyRandom::get_int<unsigned_long>(i_random,0xf);
      if (uVar2 < (ulong)((*(long *)(this + 0x13f8) - *(long *)(this + 0x13f0)) / 0x28)) {
        handle_pending_put(this,uVar2);
      }
    }
    else if (i_target_consume_count <= *(ulong *)(this + 0x13e8)) {
      **(ulong **)(this + 0x48) = *(ulong *)(this + 0x13e0);
      *(undefined8 *)(*(long *)(this + 0x48) + 8) = *(undefined8 *)(this + 0x13e8);
      std::
      vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>::ThreadData::ReentrantConsume,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>::ThreadData::ReentrantConsume>_>
      ::clear((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::ThreadData::ReentrantConsume,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::ThreadData::ReentrantConsume>_>
               *)(this + 0x1408));
      std::
      vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>::ThreadData::ReentrantPut,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>::ThreadData::ReentrantPut>_>
      ::clear((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::ThreadData::ReentrantPut,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::ThreadData::ReentrantPut>_>
               *)(this + 0x13f0));
      LOCK();
      *(undefined1 *)(*(long *)(this + 0x48) + 0x10) = 0;
      UNLOCK();
      ThreadAllocRandomFailures::~ThreadAllocRandomFailures(&scoped_alloc_failures);
      return;
    }
    if (*(ulong *)(this + 0x13e8) < i_target_consume_count) {
      uVar2 = EasyRandom::get_int<unsigned_long>(i_random,0xf);
      if (uVar2 < (ulong)(*(long *)(this + 0x1410) - *(long *)(this + 0x1408) >> 5)) {
        handle_pending_consume(this,uVar2);
      }
    }
    if (*(ulong *)(this + 0x13e8) < i_target_consume_count &&
        (*(ulong *)(this + 0x13e0) < i_target_put_count && (bVar4 & 1) == 0)) {
      iVar1 = EasyRandom::get_bool(i_random);
      if (iVar1 != 0) goto LAB_010b7f74;
LAB_010b7f7e:
      try_consume_one(this);
    }
    else if (*(ulong *)(this + 0x13e0) < i_target_put_count && (bVar4 & 1) == 0) {
LAB_010b7f74:
      put_one(this);
    }
    else {
      if (*(ulong *)(this + 0x13e8) < i_target_consume_count) goto LAB_010b7f7e;
      sched_yield();
    }
    if (cVar3 == '\0') {
      **(undefined8 **)(this + 0x48) = *(undefined8 *)(this + 0x13e0);
      *(undefined8 *)(*(long *)(this + 0x48) + 8) = *(undefined8 *)(this + 0x13e8);
      bVar4 = **(byte **)(this + 0x1420);
    }
    cVar3 = cVar3 + '\x01';
  } while( true );
}

Assistant:

void thread_procedure(
              size_t const i_target_put_count,
              size_t const i_target_consume_count,
              uint64_t     i_affinity_mask)
            {
                set_thread_affinity(i_affinity_mask);

                ThreadAllocRandomFailures scoped_alloc_failures(m_random, 0.03);

                m_incremental_stats->m_thread_is_active.store(true);

                bool too_many_enqueued = false;

                for (size_t cycles = 0; m_put_committed < i_target_put_count ||
                                        m_consumes_committed < i_target_consume_count;
                     cycles++)
                {
                    // decide between put and consume

                    if (m_put_committed < i_target_put_count)
                    {
                        auto const pending_put_index = m_random.get_int<size_t>(15);
                        if (pending_put_index < m_pending_reentrant_puts.size())
                        {
                            handle_pending_put(pending_put_index);
                        }
                    }

                    if (m_consumes_committed < i_target_consume_count)
                    {
                        auto const pending_consume_index = m_random.get_int<size_t>(15);
                        if (pending_consume_index < m_pending_reentrant_consumes.size())
                        {
                            handle_pending_consume(pending_consume_index);
                        }
                    }

                    bool const can_produce =
                      m_put_committed < i_target_put_count && !too_many_enqueued;
                    bool const can_consume = m_consumes_committed < i_target_consume_count;

                    if (can_produce && can_consume)
                    {
                        if (m_random.get_bool())
                            put_one();
                        else
                            try_consume_one();
                    }
                    else if (can_produce)
                    {
                        put_one();
                    }
                    else if (can_consume)
                    {
                        try_consume_one();
                    }
                    else
                    {
                        std::this_thread::yield();
                    }

                    // update the progress periodically
                    if ((cycles & 255) == 0)
                    {
                        m_incremental_stats->m_produced.store(
                          m_put_committed, std::memory_order_relaxed);
                        m_incremental_stats->m_consumed.store(
                          m_consumes_committed, std::memory_order_relaxed);
                        too_many_enqueued =
                          m_feedback->m_too_many_enqueued.load(std::memory_order_relaxed);
                    }
                }

                m_incremental_stats->m_produced.store(m_put_committed, std::memory_order_relaxed);
                m_incremental_stats->m_consumed.store(
                  m_consumes_committed, std::memory_order_relaxed);

                /* we destroy the pending operation (they get canceled), because otherwise the
                    destructor of the queue would trigger an undefined behavior */
                m_pending_reentrant_consumes.clear();
                m_pending_reentrant_puts.clear();

                // to do: not exception safe
                m_incremental_stats->m_thread_is_active.store(false);
            }